

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

size_t determine_serialized_size_additional_trees(IsoForest *model,size_t old_ntrees)

{
  pointer pvVar1;
  long lVar2;
  pointer pcVar3;
  long lVar4;
  pointer pIVar5;
  
  pvVar1 = (model->trees).
           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(model->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar2 != 0) {
    lVar2 = (lVar2 >> 3) * -0x5555555555555555;
    pcVar3 = (pointer)0x0;
    lVar4 = 0;
    do {
      pcVar3 = pcVar3 + 8;
      for (pIVar5 = *(pointer *)
                     &pvVar1[lVar4].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl;
          pIVar5 != *(pointer *)
                     ((long)&pvVar1[lVar4].super__Vector_base<IsoTree,_std::allocator<IsoTree>_>.
                             _M_impl + 8); pIVar5 = pIVar5 + 1) {
        pcVar3 = *(pointer *)
                  ((long)&(pIVar5->cat_split).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_> + 8) +
                 (long)pcVar3 +
                 (0x55 - *(long *)&(pIVar5->cat_split).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar2 + (ulong)(lVar2 == 0));
    return (size_t)pcVar3;
  }
  return 0;
}

Assistant:

size_t determine_serialized_size_additional_trees(const IsoForest &model, size_t old_ntrees) noexcept
{
    size_t n_bytes = 0;
    for (size_t ix = 0; ix < model.trees.size(); ix++) {
        n_bytes += sizeof(size_t);
        for (const auto &node : model.trees[ix])
            n_bytes += get_size_node(node);
    }
    return n_bytes;
}